

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_ref.c
# Opt level: O3

void randomx_argon2_fill_segment_ref(argon2_instance_t *instance,argon2_position_t position)

{
  uint uVar1;
  ulong uVar2;
  block *pbVar3;
  ulong uVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  argon2_position_t local_48;
  ulong local_38;
  
  local_48._8_8_ = position._8_8_;
  local_48._0_8_ = position._0_8_;
  if (instance != (argon2_instance_t *)0x0) {
    uVar9 = (uint)(((undefined1  [16])position & (undefined1  [16])0xff) == (undefined1  [16])0x0 &&
                  ((undefined1  [16])position & (undefined1  [16])0xffffffff) ==
                  (undefined1  [16])0x0) * 2;
    if (uVar9 < instance->segment_length) {
      uVar1 = instance->lane_length;
      iVar7 = position.lane * uVar1;
      iVar8 = instance->segment_length * (uint)position.slice;
      uVar6 = uVar9 + iVar7 + iVar8;
      uVar6 = (-(uint)(uVar6 % uVar1 != 0) | uVar1 - 1) + uVar6;
      local_38 = (ulong)(uint)(iVar8 + iVar7);
      do {
        uVar11 = (int)local_38 + uVar9;
        uVar1 = (int)local_38 + -1 + uVar9;
        if (uVar11 % instance->lane_length != 1) {
          uVar1 = uVar6;
        }
        uVar2 = instance->memory[uVar1].v[0];
        uVar4 = (uVar2 >> 0x20) % (ulong)instance->lanes;
        uVar10 = uVar4;
        if (local_48.slice == '\0') {
          uVar10 = (ulong)local_48._0_8_ >> 0x20;
        }
        if (local_48.pass != 0) {
          uVar10 = uVar4;
        }
        local_48.index = uVar9;
        uVar5 = randomx_argon2_index_alpha
                          (instance,&local_48,(uint32_t)uVar2,
                           (uint)(uVar10 == (ulong)local_48._0_8_ >> 0x20));
        pbVar3 = instance->memory;
        if ((instance->version == 0x10) || (local_48.pass == 0)) {
          iVar7 = 0;
        }
        else {
          iVar7 = 1;
        }
        fill_block(pbVar3 + uVar1,pbVar3 + instance->lane_length * uVar10 + (ulong)uVar5,
                   pbVar3 + uVar11,iVar7);
        uVar9 = uVar9 + 1;
        uVar6 = uVar1 + 1;
      } while (uVar9 < instance->segment_length);
    }
  }
  return;
}

Assistant:

void randomx_argon2_fill_segment_ref(const argon2_instance_t *instance,
	argon2_position_t position) {
	block *ref_block = NULL, *curr_block = NULL;
	block address_block, input_block, zero_block;
	uint64_t pseudo_rand, ref_index, ref_lane;
	uint32_t prev_offset, curr_offset;
	uint32_t starting_index;
	uint32_t i;

	if (instance == NULL) {
		return;
	}

	starting_index = 0;

	if ((0 == position.pass) && (0 == position.slice)) {
		starting_index = 2; /* we have already generated the first two blocks */
	}

	/* Offset of the current block */
	curr_offset = position.lane * instance->lane_length +
		position.slice * instance->segment_length + starting_index;

	if (0 == curr_offset % instance->lane_length) {
		/* Last block in this lane */
		prev_offset = curr_offset + instance->lane_length - 1;
	}
	else {
		/* Previous block */
		prev_offset = curr_offset - 1;
	}

	for (i = starting_index; i < instance->segment_length;
		++i, ++curr_offset, ++prev_offset) {
		/*1.1 Rotating prev_offset if needed */
		if (curr_offset % instance->lane_length == 1) {
			prev_offset = curr_offset - 1;
		}

		/* 1.2 Computing the index of the reference block */
		/* 1.2.1 Taking pseudo-random value from the previous block */
		pseudo_rand = instance->memory[prev_offset].v[0];

		/* 1.2.2 Computing the lane of the reference block */
		ref_lane = ((pseudo_rand >> 32)) % instance->lanes;

		if ((position.pass == 0) && (position.slice == 0)) {
			/* Can not reference other lanes yet */
			ref_lane = position.lane;
		}

		/* 1.2.3 Computing the number of possible reference block within the
		 * lane.
		 */
		position.index = i;
		ref_index = randomx_argon2_index_alpha(instance, &position, pseudo_rand & 0xFFFFFFFF,
			ref_lane == position.lane);

		/* 2 Creating a new block */
		ref_block =
			instance->memory + instance->lane_length * ref_lane + ref_index;
		curr_block = instance->memory + curr_offset;
		if (ARGON2_VERSION_10 == instance->version) {
			/* version 1.2.1 and earlier: overwrite, not XOR */
			fill_block(instance->memory + prev_offset, ref_block, curr_block, 0);
		}
		else {
			if (0 == position.pass) {
				fill_block(instance->memory + prev_offset, ref_block,
					curr_block, 0);
			}
			else {
				fill_block(instance->memory + prev_offset, ref_block,
					curr_block, 1);
			}
		}
	}
}